

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QDockAreaLayoutItem>::data(QList<QDockAreaLayoutItem> *this)

{
  QArrayDataPointer<QDockAreaLayoutItem> *this_00;
  QDockAreaLayoutItem *pQVar1;
  QArrayDataPointer<QDockAreaLayoutItem> *in_RDI;
  
  detach((QList<QDockAreaLayoutItem> *)0x58196c);
  this_00 = (QArrayDataPointer<QDockAreaLayoutItem> *)
            QArrayDataPointer<QDockAreaLayoutItem>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QDockAreaLayoutItem>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }